

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O2

bool dxil_spv::is_mangled_entry_point(char *user)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = strchr(user,0x3f);
  if (pcVar1 == (char *)0x0) {
    bVar2 = false;
  }
  else {
    pcVar1 = strchr(pcVar1 + 1,0x40);
    bVar2 = pcVar1 != (char *)0x0;
  }
  return bVar2;
}

Assistant:

bool is_mangled_entry_point(const char *user)
{
	// The mangling algorithm is intentionally left undefined in spec.
	// However, the mangling scheme clearly follows MSVC here.
	// The format we're looking for is:
	// <blah>?<identifier>@<suffix>.
	// http://www.agner.org/optimize/calling_conventions.pdf (section 8.1).
	// DXC also seems to start with '\01', but we can ignore that.
	const char *mangle_begin = strchr(user, '?');
	if (!mangle_begin)
		return false;

	const char *mangle_end = strchr(mangle_begin + 1, '@');
	return mangle_end != nullptr;
}